

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::bt_peer_connection_handle::switch_send_crypto
          (bt_peer_connection_handle *this,shared_ptr<libtorrent::crypto_plugin> *crypto)

{
  shared_ptr<libtorrent::aux::bt_peer_connection> pc;
  bt_peer_connection *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  shared_ptr<libtorrent::crypto_plugin> local_28;
  
  native_handle((bt_peer_connection_handle *)&local_38);
  local_28.super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  aux::bt_peer_connection::switch_send_crypto(local_38,&local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void bt_peer_connection_handle::switch_send_crypto(std::shared_ptr<crypto_plugin> crypto)
{
#if !defined TORRENT_DISABLE_ENCRYPTION
	std::shared_ptr<aux::bt_peer_connection> pc = native_handle();
	TORRENT_ASSERT(pc);
	pc->switch_send_crypto(std::move(crypto));
#else
	TORRENT_UNUSED(crypto);
#endif
}